

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

int archive_write_set_bytes_per_block(archive *_a,int bytes_per_block)

{
  int iVar1;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_bytes_per_block");
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    iVar1 = 0;
    if (-1 < bytes_per_block) {
      _a[1].current_codepage = bytes_per_block;
    }
  }
  return iVar1;
}

Assistant:

int
archive_write_set_bytes_per_block(struct archive *_a, int bytes_per_block)
{
	struct archive_write *a = (struct archive_write *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_bytes_per_block");

	if (bytes_per_block < 0) {
		// Do nothing if the bytes_per_block is negative
		return 0;
	}
	a->bytes_per_block = bytes_per_block;
	return (ARCHIVE_OK);
}